

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O2

PVIP_BOOL PVIP_string_concat(PVIPString *str,char *src,size_t len)

{
  size_t __size;
  char *__ptr;
  size_t sVar1;
  
  __ptr = str->buf;
  sVar1 = str->len;
  if (str->buflen < sVar1 + len) {
    __size = (sVar1 + len) * 2;
    str->buflen = __size;
    __ptr = (char *)realloc(__ptr,__size);
    str->buf = __ptr;
    if (__ptr == (char *)0x0) {
      return 0;
    }
    sVar1 = str->len;
  }
  memcpy(__ptr + sVar1,src,len);
  str->len = str->len + len;
  return 1;
}

Assistant:

PVIP_BOOL PVIP_string_concat(PVIPString *str, const char *src, size_t len) {
    if (str->len + len > str->buflen) {
        str->buflen = ( str->len + len ) * 2;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return PVIP_FALSE;
        }
    }
    memcpy(str->buf + str->len, src, len);
    str->len += len;
    return PVIP_TRUE;
}